

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>::format
          (source_linenum_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  bool bVar1;
  long in_RSI;
  scoped_padder p;
  uint field_size;
  scoped_padder *in_stack_ffffffffffffffa0;
  memory_buf_t *in_stack_ffffffffffffffa8;
  padding_info *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  scoped_padder *in_stack_ffffffffffffffc0;
  memory_buf_t *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (!bVar1) {
    fmt_helper::count_digits<int>(0);
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8);
    fmt_helper::append_int<int>(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
    scoped_padder::~scoped_padder(in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        if (msg.source.empty())
        {
            return;
        }

        auto field_size = fmt_helper::count_digits(msg.source.line);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.source.line, dest);
    }